

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.c
# Opt level: O1

size_t utf8_range_ValidateUTF8Naive(char *data,char *end,int return_position)

{
  byte bVar1;
  byte bVar2;
  size_t in_RAX;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  char cVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  lVar5 = 0;
  sVar4 = 0;
  do {
    data = (char *)((byte *)data + lVar5);
    if (end <= data) {
      if (return_position == 0) {
        lVar5 = 0;
      }
      return (1 - return_position) + sVar4 + lVar5;
    }
    lVar7 = lVar5;
    if (return_position == 0) {
      lVar7 = 0;
    }
    sVar4 = sVar4 + lVar7;
    bVar1 = *data;
    bVar9 = true;
    if ((char)bVar1 < '\0') {
      uVar8 = (long)end - (long)data;
      if (((byte)(bVar1 + 0x3e) < 0x1e && 1 < uVar8) && ((char)((byte *)data)[1] < -0x40)) {
        lVar5 = 2;
      }
      else if (uVar8 < 3) {
        bVar9 = false;
        in_RAX = sVar4;
      }
      else {
        bVar2 = ((byte *)data)[1];
        cVar6 = '\x01';
        sVar3 = sVar4;
        if ((-0x41 < (char)bVar2) || (-0x41 < (char)((byte *)data)[2])) goto LAB_00344ba2;
        if (((byte)(bVar1 + 0x1f) < 0xc) || (bVar1 == 0xe0 && 0x9f < bVar2)) {
LAB_00344b96:
          lVar5 = 3;
LAB_00344b9c:
          cVar6 = '\x02';
          sVar3 = in_RAX;
        }
        else {
          if (((bVar1 & 0xfe) == 0xee) || (bVar1 == 0xed && bVar2 < 0xa0)) goto LAB_00344b96;
          if (uVar8 != 3) {
            if (-0x41 < (char)((byte *)data)[3]) goto LAB_00344ba2;
            if ((2 < (byte)(bVar1 + 0xf)) && (bVar1 != 0xf0 || bVar2 < 0x90)) {
              lVar7 = 4;
              if (bVar2 >= 0x90 || bVar1 != 0xf4) {
                lVar7 = lVar5;
              }
              lVar5 = lVar7;
              cVar6 = (bVar2 < 0x90 && bVar1 == 0xf4) * '\x02';
              sVar3 = in_RAX;
              goto LAB_00344ba2;
            }
            lVar5 = 4;
            goto LAB_00344b9c;
          }
          cVar6 = '\0';
          sVar3 = in_RAX;
        }
LAB_00344ba2:
        in_RAX = sVar4;
        if (cVar6 != '\0') {
          in_RAX = sVar3;
        }
        bVar9 = cVar6 == '\x02';
      }
    }
    else {
      lVar5 = 1;
    }
    if (!bVar9) {
      return in_RAX;
    }
  } while( true );
}

Assistant:

static size_t utf8_range_ValidateUTF8Naive(const char* data, const char* end,
                                           int return_position) {
  /* We return err_pos in the loop which is always 0 if !return_position */
  size_t err_pos = 0;
  size_t codepoint_bytes = 0;
  /* The early check is done because of early continue's on codepoints of all
   * sizes, i.e. we first check for ascii and if it is, we call continue, then
   * for 2 byte codepoints, etc. This is done in order to reduce indentation and
   * improve readability of the codepoint validity check.
   */
  while (data + codepoint_bytes < end) {
    if (return_position) {
      err_pos += codepoint_bytes;
    }
    data += codepoint_bytes;
    const size_t len = end - data;
    const unsigned char byte1 = data[0];

    /* We do not skip many ascii bytes at the same time as this function is
       used for tail checking (< 16 bytes) and for non x86 platforms. We also
       don't think that cases where non-ASCII codepoints are followed by ascii
       happen often. For small strings it also introduces some penalty. For
       purely ascii UTF8 strings (which is the overwhelming case) we call
       SkipAscii function which is multiplatform and extremely fast.
     */
    /* [00..7F] ASCII -> 1 byte */
    if (utf8_range_AsciiIsAscii(byte1)) {
      codepoint_bytes = 1;
      continue;
    }
    /* [C2..DF], [80..BF] -> 2 bytes */
    if (len >= 2 && byte1 >= 0xC2 && byte1 <= 0xDF &&
        utf8_range_IsTrailByteOk(data[1])) {
      codepoint_bytes = 2;
      continue;
    }
    if (len >= 3) {
      const unsigned char byte2 = data[1];
      const unsigned char byte3 = data[2];

      /* Is byte2, byte3 between [0x80, 0xBF]
       * Check for 0x80 was done above.
       */
      if (!utf8_range_IsTrailByteOk(byte2) ||
          !utf8_range_IsTrailByteOk(byte3)) {
        return err_pos;
      }

      if (/* E0, A0..BF, 80..BF */
          ((byte1 == 0xE0 && byte2 >= 0xA0) ||
           /* E1..EC, 80..BF, 80..BF */
           (byte1 >= 0xE1 && byte1 <= 0xEC) ||
           /* ED, 80..9F, 80..BF */
           (byte1 == 0xED && byte2 <= 0x9F) ||
           /* EE..EF, 80..BF, 80..BF */
           (byte1 >= 0xEE && byte1 <= 0xEF))) {
        codepoint_bytes = 3;
        continue;
      }
      if (len >= 4) {
        const unsigned char byte4 = data[3];
        /* Is byte4 between 0x80 ~ 0xBF */
        if (!utf8_range_IsTrailByteOk(byte4)) {
          return err_pos;
        }

        if (/* F0, 90..BF, 80..BF, 80..BF */
            ((byte1 == 0xF0 && byte2 >= 0x90) ||
             /* F1..F3, 80..BF, 80..BF, 80..BF */
             (byte1 >= 0xF1 && byte1 <= 0xF3) ||
             /* F4, 80..8F, 80..BF, 80..BF */
             (byte1 == 0xF4 && byte2 <= 0x8F))) {
          codepoint_bytes = 4;
          continue;
        }
      }
    }
    return err_pos;
  }
  if (return_position) {
    err_pos += codepoint_bytes;
  }
  /* if return_position is false, this returns 1.
   * if return_position is true, this returns err_pos.
   */
  return err_pos + (1 - return_position);
}